

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_set.cpp
# Opt level: O0

bool std::operator==(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *s,
                    initializer_list<unsigned_int> *l)

{
  bool bVar1;
  const_iterator __first2;
  const_iterator __last2;
  const_iterator local_58;
  _Rb_tree_const_iterator<unsigned_int> local_50;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_const_unsigned_int_*> local_48;
  _Rb_tree_const_iterator<unsigned_int> local_38;
  _Rb_tree_const_iterator<unsigned_int> local_30;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_const_unsigned_int_*> local_28;
  initializer_list<unsigned_int> *local_18;
  initializer_list<unsigned_int> *l_local;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *s_local;
  
  local_18 = l;
  l_local = (initializer_list<unsigned_int> *)s;
  local_30._M_node =
       (_Base_ptr)
       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin(s);
  local_38._M_node =
       (_Base_ptr)
       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  l_local);
  __first2 = initializer_list<unsigned_int>::begin(local_18);
  __last2 = initializer_list<unsigned_int>::end(local_18);
  local_28 = mismatch<std::_Rb_tree_const_iterator<unsigned_int>,unsigned_int_const*>
                       (local_30,local_38,__first2,__last2);
  local_50._M_node =
       (_Base_ptr)
       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  l_local);
  local_58 = initializer_list<unsigned_int>::end(local_18);
  local_48 = make_pair<std::_Rb_tree_const_iterator<unsigned_int>,unsigned_int_const*>
                       (&local_50,&local_58);
  bVar1 = operator==(&local_28,&local_48);
  return bVar1;
}

Assistant:

bool operator == (const std::set<T, C, A> & s, const Coll & l)
    {
        return std::mismatch(s.begin(), s.end(), l.begin(), l.end()) == std::make_pair(s.end(), l.end());
    }